

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadT<unsigned_long>
          (BinaryReader *this,unsigned_long *out_value,char *type_name,char *desc)

{
  char *desc_local;
  char *type_name_local;
  unsigned_long *out_value_local;
  BinaryReader *this_local;
  
  if (this->read_end_ < (this->state_).offset + 8) {
    PrintError(this,"unable to read %s: %s",type_name,desc);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    *out_value = *(unsigned_long *)((this->state_).data + (this->state_).offset);
    (this->state_).offset = (this->state_).offset + 8;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadT(T* out_value,
                           const char* type_name,
                           const char* desc) {
  if (state_.offset + sizeof(T) > read_end_) {
    PrintError("unable to read %s: %s", type_name, desc);
    return Result::Error;
  }
  memcpy(out_value, state_.data + state_.offset, sizeof(T));
  state_.offset += sizeof(T);
  return Result::Ok;
}